

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

_variable_type gl4cts::ShaderSubroutine::Utils::getBaseVariableType(_variable_type *variable_type)

{
  TestError *this;
  _variable_type local_14;
  _variable_type result;
  _variable_type *variable_type_local;
  
  switch(*variable_type) {
  case VARIABLE_TYPE_BOOL:
  case VARIABLE_TYPE_BVEC2:
  case VARIABLE_TYPE_BVEC3:
  case VARIABLE_TYPE_BVEC4:
    local_14 = VARIABLE_TYPE_BOOL;
    break;
  case VARIABLE_TYPE_DOUBLE:
  case VARIABLE_TYPE_DVEC2:
  case VARIABLE_TYPE_DVEC3:
  case VARIABLE_TYPE_DVEC4:
    local_14 = VARIABLE_TYPE_DOUBLE;
    break;
  case VARIABLE_TYPE_FLOAT:
  case VARIABLE_TYPE_MAT2:
  case VARIABLE_TYPE_MAT2X3:
  case VARIABLE_TYPE_MAT2X4:
  case VARIABLE_TYPE_MAT3:
  case VARIABLE_TYPE_MAT3X2:
  case VARIABLE_TYPE_MAT3X4:
  case VARIABLE_TYPE_MAT4:
  case VARIABLE_TYPE_MAT4X2:
  case VARIABLE_TYPE_MAT4X3:
  case VARIABLE_TYPE_VEC2:
  case VARIABLE_TYPE_VEC3:
  case VARIABLE_TYPE_VEC4:
    local_14 = VARIABLE_TYPE_FLOAT;
    break;
  case VARIABLE_TYPE_INT:
  case VARIABLE_TYPE_IVEC2:
  case VARIABLE_TYPE_IVEC3:
  case VARIABLE_TYPE_IVEC4:
    local_14 = VARIABLE_TYPE_INT;
    break;
  case VARIABLE_TYPE_UINT:
  case VARIABLE_TYPE_UVEC2:
  case VARIABLE_TYPE_UVEC3:
  case VARIABLE_TYPE_UVEC4:
    local_14 = VARIABLE_TYPE_UINT;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized variable type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x412);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_14;
}

Assistant:

Utils::_variable_type Utils::getBaseVariableType(const _variable_type& variable_type)
{
	_variable_type result = VARIABLE_TYPE_UNKNOWN;

	switch (variable_type)
	{
	case VARIABLE_TYPE_BOOL:
	case VARIABLE_TYPE_BVEC2:
	case VARIABLE_TYPE_BVEC3:
	case VARIABLE_TYPE_BVEC4:
	{
		result = VARIABLE_TYPE_BOOL;

		break;
	}

	case VARIABLE_TYPE_DOUBLE:
	case VARIABLE_TYPE_DVEC2:
	case VARIABLE_TYPE_DVEC3:
	case VARIABLE_TYPE_DVEC4:
	{
		result = VARIABLE_TYPE_DOUBLE;

		break;
	}

	case VARIABLE_TYPE_FLOAT:
	case VARIABLE_TYPE_MAT2:
	case VARIABLE_TYPE_MAT2X3:
	case VARIABLE_TYPE_MAT2X4:
	case VARIABLE_TYPE_MAT3:
	case VARIABLE_TYPE_MAT3X2:
	case VARIABLE_TYPE_MAT3X4:
	case VARIABLE_TYPE_MAT4:
	case VARIABLE_TYPE_MAT4X2:
	case VARIABLE_TYPE_MAT4X3:
	case VARIABLE_TYPE_VEC2:
	case VARIABLE_TYPE_VEC3:
	case VARIABLE_TYPE_VEC4:
	{
		result = VARIABLE_TYPE_FLOAT;

		break;
	}

	case VARIABLE_TYPE_INT:
	case VARIABLE_TYPE_IVEC2:
	case VARIABLE_TYPE_IVEC3:
	case VARIABLE_TYPE_IVEC4:
	{
		result = VARIABLE_TYPE_INT;

		break;
	}

	case VARIABLE_TYPE_UINT:
	case VARIABLE_TYPE_UVEC2:
	case VARIABLE_TYPE_UVEC3:
	case VARIABLE_TYPE_UVEC4:
	{
		result = VARIABLE_TYPE_UINT;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized variable type");
	}
	} /* switch (variable_type) */

	return result;
}